

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O0

void __thiscall Am_Data_Locator::Add_Search_Directory(Am_Data_Locator *this,Am_Filename *dir)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  int local_94;
  pair<Am_Filename,_unsigned_int> local_90;
  _Self local_68 [3];
  search_pred local_50;
  _List_iterator<std::pair<Am_Filename,_unsigned_int>_> local_30;
  _List_iterator<std::pair<Am_Filename,_unsigned_int>_> local_28;
  _Self local_20;
  iterator it;
  Am_Filename *dir_local;
  Am_Data_Locator *this_local;
  
  it._M_node = (_List_node_base *)dir;
  bVar1 = Am_Filename::Is_Directory(dir);
  if (bVar1) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
         ::begin(&this->search_list);
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
         ::end(&this->search_list);
    search_pred::search_pred(&local_50,(Am_Filename *)it._M_node);
    local_20._M_node =
         (_List_node_base *)
         std::find_if<std::_List_iterator<std::pair<Am_Filename,unsigned_int>>,search_pred>
                   (local_28,local_30,&local_50);
    search_pred::~search_pred(&local_50);
    local_68[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
         ::end(&this->search_list);
    bVar1 = std::operator==(&local_20,local_68);
    if (bVar1) {
      local_94 = 1;
      std::pair<Am_Filename,_unsigned_int>::pair<int,_true>
                (&local_90,(Am_Filename *)it._M_node,&local_94);
      std::__cxx11::
      list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
      ::push_front(&this->search_list,&local_90);
      std::pair<Am_Filename,_unsigned_int>::~pair(&local_90);
    }
    else {
      ppVar2 = std::_List_iterator<std::pair<Am_Filename,_unsigned_int>_>::operator*(&local_20);
      ppVar2->second = ppVar2->second + 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Am_Data_Locator: search path ");
    poVar3 = ::operator<<(poVar3,(Am_Filename *)it._M_node);
    poVar3 = std::operator<<(poVar3," is not a directory!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
Am_Data_Locator::Add_Search_Directory(const Am_Filename &dir)
{
  if (dir.Is_Directory()) {
    dir_list_t::iterator it =
        std::find_if(search_list.begin(), search_list.end(), search_pred(dir));
    if (it == search_list.end())
      // Put the directory in first place on search list (with a count of 1)
      search_list.push_front(std::pair<Am_Filename, unsigned int>(dir, 1));
    else
      // Increments the reference count of that directory
      ++((*it).second);
  } else
    std::cout << "Am_Data_Locator: search path " << dir
              << " is not a directory!" << std::endl;
  return;
}